

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManComputeMapping(Nf_Man_t *p)

{
  word *pwVar1;
  Nf_Obj_t *pNVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj;
  word wVar5;
  int v;
  uint uVar6;
  word wVar7;
  
  v = 0;
  while( true ) {
    if (p->pGia->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar3 = Gia_ObjIsBuf(pObj);
      if (iVar3 == 0) {
        Nf_ManCutMatch(p,v);
      }
      else {
        iVar3 = Gia_ObjId(p->pGia,pObj);
        iVar4 = Gia_ObjIsBuf(pObj);
        if (iVar4 == 0) {
          __assert_fail("Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x4bf,"void Nf_ObjPrepareBuf(Nf_Man_t *, Gia_Obj_t *)");
        }
        pNVar2 = p->pNfObjs;
        iVar4 = iVar3 - (*(uint *)pObj & 0x1fffffff);
        uVar6 = *(uint *)pObj >> 0x1d & 1;
        pwVar1 = &pNVar2[iVar3].M[1][1].D;
        *pwVar1 = 0;
        pwVar1[1] = 0;
        pwVar1 = &pNVar2[iVar3].M[1][0].A;
        *pwVar1 = 0;
        pwVar1[1] = 0;
        *(undefined8 *)pNVar2[iVar3].M[1] = 0;
        pNVar2[iVar3].M[1][0].D = 0;
        pwVar1 = &pNVar2[iVar3].M[0][1].D;
        *pwVar1 = 0;
        pwVar1[1] = 0;
        pwVar1 = &pNVar2[iVar3].M[0][0].A;
        *pwVar1 = 0;
        pwVar1[1] = 0;
        *(undefined8 *)pNVar2[iVar3].M[0] = 0;
        pNVar2[iVar3].M[0][0].D = 0;
        wVar7 = pNVar2[iVar4].M[uVar6][0].D;
        pNVar2[iVar3].M[0][1].D = wVar7;
        pNVar2[iVar3].M[0][0].D = wVar7;
        wVar5 = pNVar2[iVar4].M[uVar6][0].A;
        pNVar2[iVar3].M[0][1].A = wVar5;
        pNVar2[iVar3].M[0][0].A = wVar5;
        *(undefined4 *)pNVar2[iVar3].M[0] = 0x80000000;
        wVar7 = wVar7 + p->InvDelay;
        pNVar2[iVar3].M[1][1].D = wVar7;
        pNVar2[iVar3].M[1][0].D = wVar7;
        wVar5 = wVar5 + p->InvArea;
        pNVar2[iVar3].M[1][1].A = wVar5;
        pNVar2[iVar3].M[1][0].A = wVar5;
        *(undefined4 *)(pNVar2[iVar3].M[1] + 1) = 0x40000000;
        *(undefined4 *)pNVar2[iVar3].M[1] = 0xc0000000;
      }
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Nf_ManComputeMapping( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Nf_ObjPrepareBuf( p, pObj );
        else
            Nf_ManCutMatch( p, i );
}